

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O0

amqp_rpc_reply_t * amqp_channel_close(amqp_connection_state_t state,amqp_channel_t channel,int code)

{
  uint in_ECX;
  amqp_rpc_reply_t *in_RDI;
  amqp_channel_close_t req;
  amqp_method_number_t replies [2];
  char codestr [13];
  undefined1 *decoded_request_method;
  uint in_stack_ffffffffffffffd4;
  undefined8 uVar1;
  amqp_connection_state_t in_stack_ffffffffffffffe0;
  
  uVar1 = 0x140029;
  if (((int)in_ECX < 0) || (0xffff < (int)in_ECX)) {
    amqp_rpc_reply_error(in_RDI,AMQP_STATUS_INVALID_PARAMETER);
  }
  else {
    decoded_request_method = &stack0xffffffffffffffe3;
    sprintf(&stack0xffffffffffffffe3,"%d",(ulong)in_ECX);
    amqp_simple_rpc(in_stack_ffffffffffffffe0,(amqp_channel_t)((ulong)uVar1 >> 0x30),
                    (amqp_method_number_t)uVar1,
                    (amqp_method_number_t *)((ulong)in_stack_ffffffffffffffd4 << 0x20),
                    decoded_request_method);
  }
  return in_RDI;
}

Assistant:

amqp_rpc_reply_t amqp_channel_close(amqp_connection_state_t state,
                                    amqp_channel_t channel, int code) {
  char codestr[13];
  amqp_method_number_t replies[2] = {AMQP_CHANNEL_CLOSE_OK_METHOD, 0};
  amqp_channel_close_t req;

  if (code < 0 || code > UINT16_MAX) {
    return amqp_rpc_reply_error(AMQP_STATUS_INVALID_PARAMETER);
  }

  req.reply_code = (uint16_t)code;
  req.reply_text.bytes = codestr;
  req.reply_text.len = sprintf(codestr, "%d", code);
  req.class_id = 0;
  req.method_id = 0;

  return amqp_simple_rpc(state, channel, AMQP_CHANNEL_CLOSE_METHOD, replies,
                         &req);
}